

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TMS320C64xInstPrinter.c
# Opt level: O0

void printRegPair(MCInst *MI,uint OpNo,SStream *O)

{
  cs_detail *pcVar1;
  uint RegNo;
  MCOperand *op;
  char *pcVar2;
  char *pcVar3;
  anon_union_1768_13_9c5aee68_for_cs_detail_6 *paVar4;
  uint8_t *puVar5;
  SStream *in_RDX;
  uint in_ESI;
  MCInst *in_RDI;
  cs_tms320c64x *tms320c64x;
  uint reg;
  MCOperand *Op;
  
  op = MCInst_getOperand(in_RDI,in_ESI);
  RegNo = MCOperand_getReg(op);
  pcVar2 = getRegisterName(RegNo + 1);
  pcVar3 = getRegisterName(RegNo);
  SStream_concat(in_RDX,"%s:%s",pcVar2,pcVar3);
  if (in_RDI->csh->detail != CS_OPT_OFF) {
    pcVar1 = in_RDI->flat_insn->detail;
    paVar4 = &pcVar1->field_6;
    puVar5 = pcVar1->groups + (ulong)(paVar4->x86).prefix[0] * 0x20 + 0x11;
    puVar5[0] = '@';
    puVar5[1] = '\0';
    puVar5[2] = '\0';
    puVar5[3] = '\0';
    *(uint *)((long)paVar4 + (ulong)(paVar4->x86).prefix[0] * 0x20 + 8) = RegNo;
    (paVar4->x86).prefix[0] = (paVar4->x86).prefix[0] + '\x01';
  }
  return;
}

Assistant:

static void printRegPair(MCInst *MI, unsigned OpNo, SStream *O)
{
	MCOperand *Op = MCInst_getOperand(MI, OpNo);
	unsigned reg = MCOperand_getReg(Op);
	cs_tms320c64x *tms320c64x;

	SStream_concat(O, "%s:%s", getRegisterName(reg + 1), getRegisterName(reg));

	if (MI->csh->detail) {
		tms320c64x = &MI->flat_insn->detail->tms320c64x;

		tms320c64x->operands[tms320c64x->op_count].type = TMS320C64X_OP_REGPAIR;
		tms320c64x->operands[tms320c64x->op_count].reg = reg;
		tms320c64x->op_count++;
	}
}